

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
sequence<toml::detail::either<toml::detail::sequence<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::de...>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)93>>
::invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::either<toml::detail::sequence<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::de___>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)93>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc,
          region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *reg,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               first)

{
  value_type *other;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_c0;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  either<toml::detail::sequence<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::de...>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>>>
  ::invoke<std::__cxx11::string>
            (&local_c0,
             (either<toml::detail::sequence<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::detail::sequence<toml::de___>,toml::detail::character<(char)39>>>,toml::detail::unlimited>,toml::detail::character<(char)39>>>>>
              *)this,loc);
  if (local_c0.is_ok_ == false) {
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
    this = (sequence<toml::detail::either<toml::detail::sequence<toml::detail::either<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)97,(char)122>,toml::detail::in_range<(char)65,(char)90>>,toml::detail::in_range<(char)48,(char)57>,toml::detail::character<(char)45>,toml::detail::character<(char)95>>,toml::detail::at_least<1ul>>,toml::detail::either<toml::detail::sequence<toml::detail::character<(char)34>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)31>,toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)127>>>,toml::detail::sequence<toml::detail::character<(char)92>,toml::detail::either<toml::detail::character<(char)34>,toml::detail::character<(char)92>,toml::detail::character<(char)98>,toml::detail::character<(char)102>,toml::detail::character<(char)110>,toml::detail::character<(char)114>,toml::detail::character<(char)116>,toml::de___>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)93>>
            *)reg;
  }
  else {
    other = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap(&local_c0);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator+=((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)loc,other);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::region
              ((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_70,
               (region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)loc);
    sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)93>>
    ::invoke<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,
               (sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<(char)32>,toml::detail::character<(char)9>>,toml::detail::at_least<1ul>>>,toml::detail::character<(char)93>>
                *)this,&local_70,reg,first);
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_70);
  }
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  ::cleanup(&local_c0,(EVP_PKEY_CTX *)this);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }